

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_scan_sse2_128_16.c
# Opt level: O2

parasail_result_t *
parasail_sw_table_scan_profile_sse2_128_16
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  short sVar1;
  ushort *puVar5;
  short *psVar6;
  void *pvVar7;
  parasail_matrix_t *ppVar8;
  int *piVar9;
  short sVar10;
  ulong uVar11;
  int iVar12;
  int iVar13;
  parasail_result_t *ppVar14;
  __m128i *b;
  __m128i *ptr;
  __m128i *b_00;
  __m128i *ptr_00;
  __m128i *ptr_01;
  int iVar15;
  uint uVar16;
  uint uVar17;
  long lVar18;
  char *pcVar19;
  longlong extraout_RDX;
  size_t sVar20;
  uint uVar21;
  ulong uVar22;
  long lVar23;
  int iVar24;
  char *__format;
  ulong uVar25;
  size_t __n;
  bool bVar26;
  ushort uVar27;
  undefined4 uVar28;
  ulong uVar30;
  ushort uVar42;
  undefined1 auVar31 [16];
  undefined4 uVar29;
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  __m128i alVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ushort uVar41;
  ushort uVar43;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  short sVar44;
  short sVar45;
  ushort uVar49;
  ushort uVar50;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  short sVar51;
  ushort uVar52;
  ushort uVar54;
  ushort uVar55;
  ushort uVar56;
  ushort uVar57;
  ushort uVar58;
  ushort uVar59;
  ushort uVar60;
  undefined1 auVar53 [16];
  undefined1 auVar61 [16];
  ushort uVar62;
  ushort uVar64;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  undefined1 auVar63 [16];
  ushort uVar70;
  undefined1 auVar71 [16];
  ushort uVar72;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  ushort uVar80;
  undefined1 auVar73 [16];
  ushort uVar81;
  ushort uVar82;
  ushort uVar83;
  ushort uVar84;
  ushort uVar85;
  ushort uVar86;
  ushort uVar87;
  ushort uVar88;
  ushort uVar89;
  ushort uVar90;
  ushort uVar91;
  ushort uVar92;
  ushort uVar93;
  ushort uVar94;
  ushort uVar95;
  ushort uVar96;
  __m128i c;
  uint local_178;
  int local_174;
  long local_120;
  ushort local_118;
  ushort uStack_116;
  ushort local_c8;
  ushort uStack_c6;
  ushort local_78;
  ushort uStack_76;
  short sVar2;
  short sVar3;
  short sVar4;
  size_t len;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar19 = "profile";
  }
  else {
    pvVar7 = (profile->profile16).score;
    if (pvVar7 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar19 = "profile->profile16.score";
    }
    else {
      ppVar8 = profile->matrix;
      if (ppVar8 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar19 = "profile->matrix";
      }
      else {
        uVar25 = (ulong)(uint)profile->s1Len;
        if (profile->s1Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar19 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar19 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "open";
        }
        else {
          if (-1 < gap) {
            iVar13 = -open;
            iVar15 = ppVar8->min;
            iVar24 = -iVar15;
            if (iVar15 != iVar13 && SBORROW4(iVar15,iVar13) == iVar15 + open < 0) {
              iVar24 = open;
            }
            iVar12 = ppVar8->max;
            ppVar14 = parasail_result_new_table1((uint)(uVar25 + 7) & 0x7ffffff8,s2Len);
            if (ppVar14 == (parasail_result_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            uVar22 = uVar25 + 7 >> 3;
            ppVar14->flag = ppVar14->flag | 0x8220404;
            b = parasail_memalign___m128i(0x10,uVar22);
            ptr = parasail_memalign___m128i(0x10,uVar22);
            b_00 = parasail_memalign___m128i(0x10,uVar22);
            ptr_00 = parasail_memalign___m128i(0x10,uVar22);
            ptr_01 = parasail_memalign___m128i(0x10,uVar22);
            auVar31._0_4_ = -(uint)((int)((ulong)b >> 0x20) == 0 && (int)b == 0);
            auVar31._4_4_ = -(uint)((int)ptr == 0 && (int)((ulong)ptr >> 0x20) == 0);
            auVar31._8_4_ = -(uint)((int)((ulong)b_00 >> 0x20) == 0 && (int)b_00 == 0);
            auVar31._12_4_ = -(uint)((int)ptr_00 == 0 && (int)((ulong)ptr_00 >> 0x20) == 0);
            iVar15 = movmskps(iVar15,auVar31);
            if (iVar15 != 0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_01 == (__m128i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            auVar31 = pshuflw(ZEXT416((uint)open),ZEXT416((uint)open),0);
            uVar28 = auVar31._0_4_;
            auVar31 = pshuflw(ZEXT416((uint)gap),ZEXT416((uint)gap),0);
            uVar29 = auVar31._0_4_;
            local_178 = iVar24 - 0x7fff;
            auVar31 = pshuflw(ZEXT416(local_178),ZEXT416(local_178),0);
            auVar32 = ZEXT416(CONCAT22((short)((uint)iVar13 >> 0x10),0x7ffe - (short)iVar12));
            auVar33 = pshuflw(auVar32,auVar32,0);
            uVar16 = local_178 & 0xffff;
            len = (size_t)uVar16;
            uVar21 = (uint)uVar22;
            alVar35[1]._0_4_ = -(gap * uVar21);
            auVar32 = pshuflw(ZEXT416((uint)alVar35[1]),ZEXT416((uint)alVar35[1]),0);
            uVar17 = auVar32._0_4_;
            auVar34._0_8_ = CONCAT44(uVar17,uVar17);
            auVar34._8_4_ = uVar17;
            auVar34._12_4_ = uVar17;
            auVar46._0_8_ = auVar34._0_8_ << 0x10;
            auVar46._8_8_ = auVar34._8_8_ << 0x10 | (ulong)(uVar17 >> 0x10);
            auVar34 = paddsw(auVar46,ZEXT416(uVar16));
            alVar35[0] = uVar22;
            alVar35[1]._4_4_ = 0;
            parasail_memset___m128i(b_00,alVar35,len);
            c[1] = extraout_RDX;
            c[0] = uVar22;
            parasail_memset___m128i(b,c,len);
            auVar32._4_4_ = uVar29;
            auVar32._0_4_ = uVar29;
            auVar32._8_4_ = uVar29;
            auVar32._12_4_ = uVar29;
            auVar71._4_4_ = uVar28;
            auVar71._0_4_ = uVar28;
            auVar71._8_4_ = uVar28;
            auVar71._12_4_ = uVar28;
            alVar35 = (__m128i)psubsw((undefined1  [16])0x0,auVar71);
            for (uVar17 = uVar21 - 1; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
              ptr_01[uVar17] = alVar35;
              alVar35 = (__m128i)psubsw((undefined1  [16])alVar35,auVar32);
            }
            uVar11 = (ulong)(uint)s2Len;
            __n = uVar22 << 4;
            lVar23 = uVar22 * uVar11;
            local_120 = 0;
            local_c8 = auVar33._0_2_;
            uStack_c6 = auVar33._2_2_;
            local_118 = auVar31._0_2_;
            uStack_116 = auVar31._2_2_;
            local_174 = 0;
            uVar72 = local_118;
            uVar74 = uStack_116;
            uVar75 = local_118;
            uVar76 = uStack_116;
            uVar77 = local_118;
            uVar78 = uStack_116;
            uVar79 = local_118;
            uVar80 = uStack_116;
            local_78 = local_118;
            uStack_76 = uStack_116;
            uVar27 = local_118;
            uVar41 = uStack_116;
            uVar42 = local_118;
            uVar43 = uStack_116;
            uVar49 = local_118;
            uVar50 = uStack_116;
            uVar89 = local_118;
            uVar90 = uStack_116;
            uVar91 = local_118;
            uVar92 = uStack_116;
            uVar93 = local_118;
            uVar94 = uStack_116;
            uVar95 = local_118;
            uVar96 = uStack_116;
            uVar81 = local_c8;
            uVar82 = uStack_c6;
            uVar83 = local_c8;
            uVar84 = uStack_c6;
            uVar85 = local_c8;
            uVar86 = uStack_c6;
            uVar87 = local_c8;
            uVar88 = uStack_c6;
            for (uVar22 = 0; uVar22 != uVar11; uVar22 = uVar22 + 1) {
              uVar30 = b_00[uVar21 - 1][0];
              auVar33._0_8_ = uVar30 << 0x10;
              auVar33._8_8_ = b_00[uVar21 - 1][1] << 0x10 | uVar30 >> 0x30;
              iVar15 = ppVar8->mapper[(byte)s2[uVar22]];
              auVar36 = (undefined1  [16])0x0;
              uVar52 = local_118;
              uVar54 = uStack_116;
              uVar55 = local_118;
              uVar56 = uStack_116;
              uVar57 = local_118;
              uVar58 = uStack_116;
              uVar59 = local_118;
              uVar60 = uStack_116;
              for (sVar20 = 0; __n != sVar20; sVar20 = sVar20 + 0x10) {
                auVar31 = *(undefined1 (*) [16])((long)*b_00 + sVar20);
                auVar61 = psubsw(*(undefined1 (*) [16])((long)*b + sVar20),auVar32);
                auVar63 = psubsw(auVar31,auVar71);
                auVar46 = paddsw(auVar33,*(undefined1 (*) [16])
                                          ((long)pvVar7 +
                                          sVar20 + (long)(int)(iVar15 * uVar21) * 0x10));
                auVar33 = paddsw(auVar36,*(undefined1 (*) [16])((long)*ptr_01 + sVar20));
                sVar44 = auVar61._0_2_;
                sVar45 = auVar63._0_2_;
                uVar62 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._2_2_;
                sVar45 = auVar63._2_2_;
                uVar64 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._4_2_;
                sVar45 = auVar63._4_2_;
                uVar65 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._6_2_;
                sVar45 = auVar63._6_2_;
                uVar66 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._8_2_;
                sVar45 = auVar63._8_2_;
                uVar67 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._10_2_;
                sVar45 = auVar63._10_2_;
                uVar68 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._12_2_;
                sVar45 = auVar63._12_2_;
                sVar51 = auVar63._14_2_;
                uVar69 = (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar61._14_2_;
                uVar70 = (ushort)(sVar51 < sVar44) * sVar44 | (ushort)(sVar51 >= sVar44) * sVar51;
                sVar44 = auVar33._0_2_;
                uVar52 = (ushort)((short)uVar52 < sVar44) * sVar44 |
                         ((short)uVar52 >= sVar44) * uVar52;
                sVar44 = auVar33._2_2_;
                uVar54 = (ushort)((short)uVar54 < sVar44) * sVar44 |
                         ((short)uVar54 >= sVar44) * uVar54;
                sVar44 = auVar33._4_2_;
                uVar55 = (ushort)((short)uVar55 < sVar44) * sVar44 |
                         ((short)uVar55 >= sVar44) * uVar55;
                sVar44 = auVar33._6_2_;
                uVar56 = (ushort)((short)uVar56 < sVar44) * sVar44 |
                         ((short)uVar56 >= sVar44) * uVar56;
                sVar44 = auVar33._8_2_;
                uVar57 = (ushort)((short)uVar57 < sVar44) * sVar44 |
                         ((short)uVar57 >= sVar44) * uVar57;
                sVar44 = auVar33._10_2_;
                uVar58 = (ushort)((short)uVar58 < sVar44) * sVar44 |
                         ((short)uVar58 >= sVar44) * uVar58;
                sVar44 = auVar33._12_2_;
                uVar59 = (ushort)((short)uVar59 < sVar44) * sVar44 |
                         ((short)uVar59 >= sVar44) * uVar59;
                sVar44 = auVar33._14_2_;
                uVar60 = (ushort)((short)uVar60 < sVar44) * sVar44 |
                         ((short)uVar60 >= sVar44) * uVar60;
                sVar44 = auVar46._0_2_;
                auVar36._0_2_ =
                     (sVar44 < (short)uVar62) * uVar62 | (ushort)(sVar44 >= (short)uVar62) * sVar44;
                sVar44 = auVar46._2_2_;
                auVar36._2_2_ =
                     (sVar44 < (short)uVar64) * uVar64 | (ushort)(sVar44 >= (short)uVar64) * sVar44;
                sVar44 = auVar46._4_2_;
                auVar36._4_2_ =
                     (sVar44 < (short)uVar65) * uVar65 | (ushort)(sVar44 >= (short)uVar65) * sVar44;
                sVar44 = auVar46._6_2_;
                auVar36._6_2_ =
                     (sVar44 < (short)uVar66) * uVar66 | (ushort)(sVar44 >= (short)uVar66) * sVar44;
                sVar44 = auVar46._8_2_;
                auVar36._8_2_ =
                     (sVar44 < (short)uVar67) * uVar67 | (ushort)(sVar44 >= (short)uVar67) * sVar44;
                sVar44 = auVar46._10_2_;
                auVar36._10_2_ =
                     (sVar44 < (short)uVar68) * uVar68 | (ushort)(sVar44 >= (short)uVar68) * sVar44;
                sVar44 = auVar46._12_2_;
                sVar45 = auVar46._14_2_;
                auVar36._12_2_ =
                     (sVar44 < (short)uVar69) * uVar69 | (ushort)(sVar44 >= (short)uVar69) * sVar44;
                auVar36._14_2_ =
                     (sVar45 < (short)uVar70) * uVar70 | (ushort)(sVar45 >= (short)uVar70) * sVar45;
                puVar5 = (ushort *)((long)*b + sVar20);
                *puVar5 = uVar62;
                puVar5[1] = uVar64;
                puVar5[2] = uVar65;
                puVar5[3] = uVar66;
                puVar5[4] = uVar67;
                puVar5[5] = uVar68;
                puVar5[6] = uVar69;
                puVar5[7] = uVar70;
                *(undefined1 (*) [16])((long)*ptr + sVar20) = auVar36;
                auVar33 = auVar31;
              }
              uVar30 = auVar36._0_8_;
              auVar63._0_8_ = uVar30 << 0x10;
              auVar63._8_8_ = auVar36._8_8_ << 0x10 | uVar30 >> 0x30;
              auVar31 = paddsw((undefined1  [16])*ptr_01,auVar63);
              sVar44 = auVar31._0_2_;
              auVar61._0_2_ =
                   (ushort)((short)uVar52 < sVar44) * sVar44 | ((short)uVar52 >= sVar44) * uVar52;
              sVar44 = auVar31._2_2_;
              auVar61._2_2_ =
                   (ushort)((short)uVar54 < sVar44) * sVar44 | ((short)uVar54 >= sVar44) * uVar54;
              sVar44 = auVar31._4_2_;
              auVar61._4_2_ =
                   (ushort)((short)uVar55 < sVar44) * sVar44 | ((short)uVar55 >= sVar44) * uVar55;
              sVar44 = auVar31._6_2_;
              auVar61._6_2_ =
                   (ushort)((short)uVar56 < sVar44) * sVar44 | ((short)uVar56 >= sVar44) * uVar56;
              sVar44 = auVar31._8_2_;
              auVar61._8_2_ =
                   (ushort)((short)uVar57 < sVar44) * sVar44 | ((short)uVar57 >= sVar44) * uVar57;
              sVar44 = auVar31._10_2_;
              auVar61._10_2_ =
                   (ushort)((short)uVar58 < sVar44) * sVar44 | ((short)uVar58 >= sVar44) * uVar58;
              sVar44 = auVar31._12_2_;
              auVar61._12_2_ =
                   (ushort)((short)uVar59 < sVar44) * sVar44 | ((short)uVar59 >= sVar44) * uVar59;
              sVar44 = auVar31._14_2_;
              auVar61._14_2_ =
                   (ushort)((short)uVar60 < sVar44) * sVar44 | ((short)uVar60 >= sVar44) * uVar60;
              iVar15 = 6;
              while( true ) {
                auVar47._0_8_ = auVar61._0_8_ << 0x10;
                auVar47._8_8_ = auVar61._8_8_ << 0x10 | auVar61._0_8_ >> 0x30;
                bVar26 = iVar15 == 0;
                iVar15 = iVar15 + -1;
                if (bVar26) break;
                auVar31 = paddsw(auVar47,auVar34);
                sVar44 = auVar31._0_2_;
                sVar45 = auVar61._0_2_;
                auVar53._0_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._2_2_;
                sVar45 = auVar61._2_2_;
                auVar53._2_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._4_2_;
                sVar45 = auVar61._4_2_;
                auVar53._4_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._6_2_;
                sVar45 = auVar61._6_2_;
                auVar53._6_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._8_2_;
                sVar45 = auVar61._8_2_;
                auVar53._8_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._10_2_;
                sVar45 = auVar61._10_2_;
                auVar53._10_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._12_2_;
                sVar45 = auVar61._12_2_;
                sVar51 = auVar61._14_2_;
                auVar53._12_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._14_2_;
                auVar53._14_2_ =
                     (ushort)(sVar51 < sVar44) * sVar44 | (ushort)(sVar51 >= sVar44) * sVar51;
                auVar61 = auVar53;
              }
              auVar48 = paddsw(auVar47,ZEXT416(uVar16));
              sVar44 = (ushort)(-1 < auVar36._0_2_) * auVar36._0_2_;
              sVar45 = (ushort)(-1 < auVar36._2_2_) * auVar36._2_2_;
              sVar51 = (ushort)(-1 < auVar63._0_8_) * auVar36._4_2_;
              sVar1 = (ushort)(-1 < (long)uVar30) * auVar36._6_2_;
              sVar2 = (ushort)(-1 < auVar36._8_2_) * auVar36._8_2_;
              sVar3 = (ushort)(-1 < auVar36._10_2_) * auVar36._10_2_;
              sVar4 = (ushort)(-1 < (long)auVar63._8_8_) * auVar36._12_2_;
              sVar10 = auVar48._2_2_;
              auVar37._2_2_ =
                   (ushort)(sVar44 < sVar10) * sVar10 | (ushort)(sVar44 >= sVar10) * sVar44;
              auVar37._0_2_ = (ushort)(0 < auVar48._0_2_) * auVar48._0_2_;
              sVar44 = auVar48._4_2_;
              auVar37._4_2_ =
                   (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
              sVar44 = auVar48._6_2_;
              auVar37._6_2_ =
                   (ushort)(sVar51 < sVar44) * sVar44 | (ushort)(sVar51 >= sVar44) * sVar51;
              sVar44 = auVar48._8_2_;
              auVar37._8_2_ = (ushort)(sVar1 < sVar44) * sVar44 | (ushort)(sVar1 >= sVar44) * sVar1;
              sVar44 = auVar48._10_2_;
              auVar37._10_2_ = (ushort)(sVar2 < sVar44) * sVar44 | (ushort)(sVar2 >= sVar44) * sVar2
              ;
              sVar44 = auVar48._12_2_;
              auVar37._12_2_ = (ushort)(sVar3 < sVar44) * sVar44 | (ushort)(sVar3 >= sVar44) * sVar3
              ;
              sVar44 = auVar48._14_2_;
              auVar37._14_2_ = (ushort)(sVar4 < sVar44) * sVar44 | (ushort)(sVar4 >= sVar44) * sVar4
              ;
              lVar18 = local_120;
              for (sVar20 = 0; __n != sVar20; sVar20 = sVar20 + 0x10) {
                auVar33 = psubsw(auVar48,auVar32);
                auVar31 = psubsw(auVar37,auVar71);
                sVar44 = auVar31._0_2_;
                sVar45 = auVar33._0_2_;
                auVar48._0_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._2_2_;
                sVar45 = auVar33._2_2_;
                auVar48._2_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._4_2_;
                sVar45 = auVar33._4_2_;
                auVar48._4_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._6_2_;
                sVar45 = auVar33._6_2_;
                auVar48._6_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._8_2_;
                sVar45 = auVar33._8_2_;
                auVar48._8_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._10_2_;
                sVar45 = auVar33._10_2_;
                auVar48._10_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._12_2_;
                sVar45 = auVar33._12_2_;
                sVar51 = auVar33._14_2_;
                auVar48._12_2_ =
                     (ushort)(sVar45 < sVar44) * sVar44 | (ushort)(sVar45 >= sVar44) * sVar45;
                sVar44 = auVar31._14_2_;
                auVar48._14_2_ =
                     (ushort)(sVar51 < sVar44) * sVar44 | (ushort)(sVar51 >= sVar44) * sVar51;
                psVar6 = (short *)((long)*ptr + sVar20);
                sVar44 = *psVar6;
                sVar45 = psVar6[1];
                sVar51 = psVar6[2];
                sVar1 = psVar6[3];
                sVar4 = psVar6[4];
                sVar2 = psVar6[5];
                sVar3 = psVar6[6];
                sVar10 = psVar6[7];
                uVar56 = (sVar44 < (short)auVar48._0_2_) * auVar48._0_2_ |
                         (ushort)(sVar44 >= (short)auVar48._0_2_) * sVar44;
                uVar52 = (sVar45 < (short)auVar48._2_2_) * auVar48._2_2_ |
                         (ushort)(sVar45 >= (short)auVar48._2_2_) * sVar45;
                uVar54 = (sVar51 < (short)auVar48._4_2_) * auVar48._4_2_ |
                         (ushort)(sVar51 >= (short)auVar48._4_2_) * sVar51;
                uVar55 = (sVar1 < (short)auVar48._6_2_) * auVar48._6_2_ |
                         (ushort)(sVar1 >= (short)auVar48._6_2_) * sVar1;
                uVar57 = (sVar4 < (short)auVar48._8_2_) * auVar48._8_2_ |
                         (ushort)(sVar4 >= (short)auVar48._8_2_) * sVar4;
                uVar58 = (sVar2 < (short)auVar48._10_2_) * auVar48._10_2_ |
                         (ushort)(sVar2 >= (short)auVar48._10_2_) * sVar2;
                uVar59 = (sVar3 < (short)auVar48._12_2_) * auVar48._12_2_ |
                         (ushort)(sVar3 >= (short)auVar48._12_2_) * sVar3;
                uVar60 = (sVar10 < (short)auVar48._14_2_) * auVar48._14_2_ |
                         (ushort)(sVar10 >= (short)auVar48._14_2_) * sVar10;
                uVar56 = (-1 < (short)uVar56) * uVar56;
                uVar52 = (-1 < (short)uVar52) * uVar52;
                auVar37._2_2_ = uVar52;
                auVar37._0_2_ = uVar56;
                uVar54 = (-1 < (short)uVar54) * uVar54;
                auVar37._4_2_ = uVar54;
                uVar55 = (-1 < (short)uVar55) * uVar55;
                auVar37._6_2_ = uVar55;
                uVar57 = (-1 < (short)uVar57) * uVar57;
                auVar37._8_2_ = uVar57;
                uVar58 = (-1 < (short)uVar58) * uVar58;
                auVar37._10_2_ = uVar58;
                uVar59 = (-1 < (short)uVar59) * uVar59;
                auVar37._12_2_ = uVar59;
                uVar60 = (-1 < (short)uVar60) * uVar60;
                auVar37._14_2_ = uVar60;
                *(undefined1 (*) [16])((long)*b_00 + sVar20) = auVar37;
                piVar9 = ((ppVar14->field_4).rowcols)->score_row;
                *(uint *)((long)piVar9 + lVar18) = (uint)uVar56;
                *(uint *)((long)piVar9 + lVar23 * 4 + lVar18) = (uint)uVar52;
                *(uint *)((long)piVar9 + lVar23 * 8 + lVar18) = (uint)uVar54;
                *(uint *)((long)piVar9 + lVar23 * 0xc + lVar18) = (uint)uVar55;
                *(uint *)((long)piVar9 + lVar23 * 0x10 + lVar18) = (uint)uVar57;
                uVar81 = ((short)uVar56 < (short)uVar81) * uVar56 |
                         ((short)uVar56 >= (short)uVar81) * uVar81;
                uVar82 = ((short)uVar52 < (short)uVar82) * uVar52 |
                         ((short)uVar52 >= (short)uVar82) * uVar82;
                uVar83 = ((short)uVar54 < (short)uVar83) * uVar54 |
                         ((short)uVar54 >= (short)uVar83) * uVar83;
                uVar84 = ((short)uVar55 < (short)uVar84) * uVar55 |
                         ((short)uVar55 >= (short)uVar84) * uVar84;
                uVar85 = ((short)uVar57 < (short)uVar85) * uVar57 |
                         ((short)uVar57 >= (short)uVar85) * uVar85;
                uVar86 = ((short)uVar58 < (short)uVar86) * uVar58 |
                         ((short)uVar58 >= (short)uVar86) * uVar86;
                uVar87 = ((short)uVar59 < (short)uVar87) * uVar59 |
                         ((short)uVar59 >= (short)uVar87) * uVar87;
                uVar88 = ((short)uVar60 < (short)uVar88) * uVar60 |
                         ((short)uVar60 >= (short)uVar88) * uVar88;
                *(uint *)((long)piVar9 + lVar23 * 0x14 + lVar18) = (uint)uVar58;
                uVar72 = ((short)uVar72 < (short)uVar56) * uVar56 |
                         ((short)uVar72 >= (short)uVar56) * uVar72;
                uVar74 = ((short)uVar74 < (short)uVar52) * uVar52 |
                         ((short)uVar74 >= (short)uVar52) * uVar74;
                uVar75 = ((short)uVar75 < (short)uVar54) * uVar54 |
                         ((short)uVar75 >= (short)uVar54) * uVar75;
                uVar76 = ((short)uVar76 < (short)uVar55) * uVar55 |
                         ((short)uVar76 >= (short)uVar55) * uVar76;
                uVar77 = ((short)uVar77 < (short)uVar57) * uVar57 |
                         ((short)uVar77 >= (short)uVar57) * uVar77;
                uVar78 = ((short)uVar78 < (short)uVar58) * uVar58 |
                         ((short)uVar78 >= (short)uVar58) * uVar78;
                uVar79 = ((short)uVar79 < (short)uVar59) * uVar59 |
                         ((short)uVar79 >= (short)uVar59) * uVar79;
                uVar80 = ((short)uVar80 < (short)uVar60) * uVar60 |
                         ((short)uVar80 >= (short)uVar60) * uVar80;
                *(uint *)((long)piVar9 + lVar23 * 0x18 + lVar18) = (uint)uVar59;
                *(uint *)((long)piVar9 + lVar23 * 0x1c + lVar18) = (uint)uVar60;
                uVar89 = ((short)uVar89 < (short)uVar56) * uVar56 |
                         ((short)uVar89 >= (short)uVar56) * uVar89;
                uVar90 = ((short)uVar90 < (short)uVar52) * uVar52 |
                         ((short)uVar90 >= (short)uVar52) * uVar90;
                uVar91 = ((short)uVar91 < (short)uVar54) * uVar54 |
                         ((short)uVar91 >= (short)uVar54) * uVar91;
                uVar92 = ((short)uVar92 < (short)uVar55) * uVar55 |
                         ((short)uVar92 >= (short)uVar55) * uVar92;
                uVar93 = ((short)uVar93 < (short)uVar57) * uVar57 |
                         ((short)uVar93 >= (short)uVar57) * uVar93;
                uVar94 = ((short)uVar94 < (short)uVar58) * uVar58 |
                         ((short)uVar94 >= (short)uVar58) * uVar94;
                uVar95 = ((short)uVar95 < (short)uVar59) * uVar59 |
                         ((short)uVar95 >= (short)uVar59) * uVar95;
                uVar96 = ((short)uVar96 < (short)uVar60) * uVar60 |
                         ((short)uVar96 >= (short)uVar60) * uVar96;
                lVar18 = lVar18 + uVar11 * 4;
              }
              auVar38._0_2_ = -(ushort)((short)local_78 < (short)uVar89);
              auVar38._2_2_ = -(ushort)((short)uStack_76 < (short)uVar90);
              auVar38._4_2_ = -(ushort)((short)uVar27 < (short)uVar91);
              auVar38._6_2_ = -(ushort)((short)uVar41 < (short)uVar92);
              auVar38._8_2_ = -(ushort)((short)uVar42 < (short)uVar93);
              auVar38._10_2_ = -(ushort)((short)uVar43 < (short)uVar94);
              auVar38._12_2_ = -(ushort)((short)uVar49 < (short)uVar95);
              auVar38._14_2_ = -(ushort)((short)uVar50 < (short)uVar96);
              if ((((((((((((((((auVar38 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                               (auVar38 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                              (auVar38 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                             (auVar38 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar38 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar38 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar38 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar38 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar38 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar38 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar38 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar38 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar38 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar38 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar38._14_2_ >> 7 & 1) != 0) || (auVar38._14_2_ & 0x8000) != 0) {
                uVar27 = ((short)uVar93 < (short)uVar89) * uVar89 |
                         ((short)uVar93 >= (short)uVar89) * uVar93;
                uVar41 = ((short)uVar94 < (short)uVar90) * uVar90 |
                         ((short)uVar94 >= (short)uVar90) * uVar94;
                uVar42 = ((short)uVar95 < (short)uVar91) * uVar91 |
                         ((short)uVar95 >= (short)uVar91) * uVar95;
                uVar43 = ((short)uVar96 < (short)uVar92) * uVar92 |
                         ((short)uVar96 >= (short)uVar92) * uVar96;
                sVar45 = (0 < (short)uVar93) * uVar93;
                sVar44 = (0 < (short)uVar94) * uVar94;
                sVar51 = (0 < (short)uVar95) * uVar95;
                sVar1 = (0 < (short)uVar96) * uVar96;
                uVar27 = ((short)uVar42 < (short)uVar27) * uVar27 |
                         ((short)uVar42 >= (short)uVar27) * uVar42;
                uVar41 = ((short)uVar43 < (short)uVar41) * uVar41 |
                         ((short)uVar43 >= (short)uVar41) * uVar43;
                uVar42 = (sVar45 < (short)uVar42) * uVar42 |
                         (ushort)(sVar45 >= (short)uVar42) * sVar45;
                uVar43 = (sVar44 < (short)uVar43) * uVar43 |
                         (ushort)(sVar44 >= (short)uVar43) * sVar44;
                uVar49 = (ushort)(sVar51 < sVar45) * sVar45 | (ushort)(sVar51 >= sVar45) * sVar51;
                uVar50 = (ushort)(sVar1 < sVar44) * sVar44 | (ushort)(sVar1 >= sVar44) * sVar1;
                sVar51 = (ushort)(0 < sVar51) * sVar51;
                sVar1 = (ushort)(0 < sVar1) * sVar1;
                auVar39._0_4_ =
                     CONCAT22(((short)uVar42 < (short)uVar41) * uVar41 |
                              ((short)uVar42 >= (short)uVar41) * uVar42,
                              ((short)uVar41 < (short)uVar27) * uVar27 |
                              ((short)uVar41 >= (short)uVar27) * uVar41);
                auVar39._4_2_ =
                     ((short)uVar43 < (short)uVar42) * uVar42 |
                     ((short)uVar43 >= (short)uVar42) * uVar43;
                auVar39._6_2_ =
                     ((short)uVar49 < (short)uVar43) * uVar43 |
                     ((short)uVar49 >= (short)uVar43) * uVar49;
                auVar39._8_2_ =
                     ((short)uVar50 < (short)uVar49) * uVar49 |
                     ((short)uVar50 >= (short)uVar49) * uVar50;
                auVar39._10_2_ =
                     (sVar51 < (short)uVar50) * uVar50 | (ushort)(sVar51 >= (short)uVar50) * sVar51;
                auVar39._12_2_ =
                     (ushort)(sVar1 < sVar51) * sVar51 | (ushort)(sVar1 >= sVar51) * sVar1;
                auVar39._14_2_ = (ushort)(0 < sVar1) * sVar1;
                auVar31 = pshuflw(auVar39,auVar39,0);
                memcpy(ptr_00,b_00,__n);
                local_78 = auVar31._0_2_;
                uStack_76 = auVar31._2_2_;
                local_174 = (int)uVar22;
                uVar27 = local_78;
                uVar41 = uStack_76;
                uVar42 = local_78;
                uVar43 = uStack_76;
                uVar49 = local_78;
                uVar50 = uStack_76;
                local_178 = auVar39._0_4_;
              }
              local_120 = local_120 + 4;
            }
            uVar22 = 0;
            sVar44 = (short)local_178;
            while( true ) {
              iVar15 = (int)uVar25;
              if ((uVar21 & 0xfffffff) << 3 == (uint)uVar22) break;
              if ((*(short *)((long)*ptr_00 + uVar22 * 2) == sVar44) &&
                 (uVar17 = ((uint)uVar22 & 7) * uVar21 + ((uint)(uVar22 >> 3) & 0x1fffffff),
                 (int)uVar17 < iVar15)) {
                uVar25 = (ulong)uVar17;
              }
              uVar22 = uVar22 + 1;
            }
            auVar40._0_2_ = -(ushort)((short)uVar81 < (short)local_118);
            auVar40._2_2_ = -(ushort)((short)uVar82 < (short)uStack_116);
            auVar40._4_2_ = -(ushort)((short)uVar83 < (short)local_118);
            auVar40._6_2_ = -(ushort)((short)uVar84 < (short)uStack_116);
            auVar40._8_2_ = -(ushort)((short)uVar85 < (short)local_118);
            auVar40._10_2_ = -(ushort)((short)uVar86 < (short)uStack_116);
            auVar40._12_2_ = -(ushort)((short)uVar87 < (short)local_118);
            auVar40._14_2_ = -(ushort)((short)uVar88 < (short)uStack_116);
            auVar73._0_2_ = -(ushort)((short)local_c8 < (short)uVar72);
            auVar73._2_2_ = -(ushort)((short)uStack_c6 < (short)uVar74);
            auVar73._4_2_ = -(ushort)((short)local_c8 < (short)uVar75);
            auVar73._6_2_ = -(ushort)((short)uStack_c6 < (short)uVar76);
            auVar73._8_2_ = -(ushort)((short)local_c8 < (short)uVar77);
            auVar73._10_2_ = -(ushort)((short)uStack_c6 < (short)uVar78);
            auVar73._12_2_ = -(ushort)((short)local_c8 < (short)uVar79);
            auVar73._14_2_ = -(ushort)((short)uStack_c6 < (short)uVar80);
            auVar73 = auVar73 | auVar40;
            if ((((((((((((((((auVar73 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar73 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar73 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                           (auVar73 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar73 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                         (auVar73 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar73 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar73 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar73 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar73 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar73 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar73 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar73 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar73 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar73 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar73[0xf] < '\0') {
              *(byte *)&ppVar14->flag = (byte)ppVar14->flag | 0x40;
              sVar44 = 0;
              local_174 = 0;
              iVar15 = 0;
            }
            ppVar14->score = (int)sVar44;
            ppVar14->end_query = iVar15;
            ppVar14->end_ref = local_174;
            parasail_free(ptr_01);
            parasail_free(ptr_00);
            parasail_free(b_00);
            parasail_free(ptr);
            parasail_free(b);
            return ppVar14;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar19 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_sw_table_scan_profile_sse2_128_16",pcVar19);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict pvP = NULL;
    __m128i* restrict pvE = NULL;
    __m128i* restrict pvHt = NULL;
    __m128i* restrict pvH = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvGapper = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int16_t NEG_LIMIT = 0;
    int16_t POS_LIMIT = 0;
    __m128i vZero;
    int16_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    __m128i vNegInfFront;
    __m128i vSegLenXgap;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile16.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP = (__m128i*)profile->profile16.score;
    vGapO = _mm_set1_epi16(open);
    vGapE = _mm_set1_epi16(gap);
    NEG_LIMIT = (-open < matrix->min ? INT16_MIN + open : INT16_MIN - matrix->min) + 1;
    POS_LIMIT = INT16_MAX - matrix->max - 1;
    vZero = _mm_setzero_si128();
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi16(NEG_LIMIT);
    vPosLimit = _mm_set1_epi16(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxHUnit = vNegLimit;
    vNegInfFront = vZero;
    vNegInfFront = _mm_insert_epi16(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm_adds_epi16(vNegInfFront,
            _mm_slli_si128(_mm_set1_epi16(-segLen*gap), 2));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_BITS_16 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE = parasail_memalign___m128i(16, segLen);
    pvHt= parasail_memalign___m128i(16, segLen);
    pvH = parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvGapper = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvHt) return NULL;
    if (!pvH) return NULL;
    if (!pvHMax) return NULL;
    if (!pvGapper) return NULL;

    parasail_memset___m128i(pvH, vZero, segLen);
    parasail_memset___m128i(pvE, vNegLimit, segLen);
    {
        __m128i vGapper = _mm_subs_epi16(vZero,vGapO);
        for (i=segLen-1; i>=0; --i) {
            _mm_store_si128(pvGapper+i, vGapper);
            vGapper = _mm_subs_epi16(vGapper, vGapE);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vHt;
        __m128i vF;
        __m128i vH;
        __m128i vHp;
        __m128i *pvW;
        __m128i vW;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm_load_si128(pvH+(segLen-1));
        vHp = _mm_slli_si128(vHp, 2);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        for (i=0; i<segLen; ++i) {
            vH = _mm_load_si128(pvH+i);
            vE = _mm_load_si128(pvE+i);
            vW = _mm_load_si128(pvW+i);
            vE = _mm_max_epi16(
                    _mm_subs_epi16(vE, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vHp = _mm_adds_epi16(vHp, vW);
            vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[i]));
            vHt = _mm_max_epi16(vE, vHp);
            _mm_store_si128(pvE+i, vE);
            _mm_store_si128(pvHt+i, vHt);
            vHp = vH;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm_slli_si128(vHt, 2);
        vF = _mm_max_epi16(vF, _mm_adds_epi16(vHt, pvGapper[0]));
        for (i=0; i<segWidth-2; ++i) {
            __m128i vFt = _mm_slli_si128(vF, 2);
            vFt = _mm_adds_epi16(vFt, vSegLenXgap);
            vF = _mm_max_epi16(vF, vFt);
        }

        /* calculate final H */
        vF = _mm_slli_si128(vF, 2);
        vF = _mm_adds_epi16(vF, vNegInfFront);
        vH = _mm_max_epi16(vHt, vF);
        vH = _mm_max_epi16(vH, vZero);
        for (i=0; i<segLen; ++i) {
            vHt = _mm_load_si128(pvHt+i);
            vF = _mm_max_epi16(
                    _mm_subs_epi16(vF, vGapE),
                    _mm_subs_epi16(vH, vGapO));
            vH = _mm_max_epi16(vHt, vF);
            vH = _mm_max_epi16(vH, vZero);
            _mm_store_si128(pvH+i, vH);
            vSaturationCheckMin = _mm_min_epi16(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm_max_epi16(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi16(vH, vMaxH);
        } 

        {
            __m128i vCompare = _mm_cmpgt_epi16(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi16_rpl(vMaxH);
                vMaxHUnit = _mm_set1_epi16(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m128i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m128i vH = _mm_load_si128(pvH + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 2);
            }
            result->rowcols->score_row[j] = (int16_t) _mm_extract_epi16 (vH, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int16_t *t = (int16_t*)pvHMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvH+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi16(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi16(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvGapper);
    parasail_free(pvHMax);
    parasail_free(pvH);
    parasail_free(pvHt);
    parasail_free(pvE);

    return result;
}